

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void loadCPP(pixels *p,string *filename,bool tiled,int fw,int fh,int dwx,int dwy)

{
  int iVar1;
  Vec2 *pVVar2;
  Slice *pSVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000011;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar8;
  long lVar9;
  ulong uVar10;
  V2i origin;
  InputFile in;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  FrameBuffer fb;
  undefined1 local_68 [56];
  
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(&in,(char *)filename,iVar4);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar2 = (Vec2 *)(p->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar4 = p->_stride_x;
  origin.x = fh;
  origin.y = dwx;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  iVar1 = *(int *)(lVar6 + 4);
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  lVar9 = (long)(int)CONCAT71(in_register_00000011,tiled);
  uVar10 = (ulong)fw;
  Imf_3_4::Slice::Make
            ((PixelType)local_68,(void *)0x0,pVVar2,(long)&origin,lVar9,uVar10,0,iVar4 << 2,iVar1,
             0.0,SUB41(*(undefined4 *)(lVar6 + 8),0),false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x3490c4);
  pVVar2 = (Vec2 *)(p->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  iVar4 = p->_stride_x;
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  iVar1 = *(int *)(lVar6 + 4);
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  Imf_3_4::Slice::Make
            ((PixelType)local_68,(void *)0x1,pVVar2,(long)&origin,lVar9,uVar10,0,iVar4 * 2,iVar1,0.0
             ,SUB41(*(undefined4 *)(lVar6 + 8),0),false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x180bdc);
  pvVar8 = p->rgba;
  lVar6 = 0;
  do {
    pSVar3 = *(Slice **)((long)channels + lVar6);
    pVVar2 = (Vec2 *)(pvVar8->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start;
    iVar4 = p->_stride_x;
    Imf_3_4::InputFile::header();
    pcVar5 = (char *)Imf_3_4::Header::channels();
    lVar7 = Imf_3_4::ChannelList::operator[](pcVar5);
    iVar1 = *(int *)(lVar7 + 4);
    Imf_3_4::InputFile::header();
    pcVar5 = (char *)Imf_3_4::Header::channels();
    lVar7 = Imf_3_4::ChannelList::operator[](pcVar5);
    Imf_3_4::Slice::Make
              ((PixelType)local_68,(void *)0x1,pVVar2,(long)&origin,lVar9,uVar10,0,iVar4 * 2,iVar1,
               0.0,SUB41(*(undefined4 *)(lVar7 + 8),0),false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,pSVar3);
    pvVar8 = pvVar8 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  pVVar2 = (Vec2 *)(p->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar4 = p->_stride_x;
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  iVar1 = *(int *)(lVar6 + 4);
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  Imf_3_4::Slice::Make
            ((PixelType)local_68,(void *)0x2,pVVar2,(long)&origin,lVar9,uVar10,0,iVar4 << 2,iVar1,
             0.0,SUB41(*(undefined4 *)(lVar6 + 8),0),false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x34911e);
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&in);
  Imf_3_4::InputFile::readPixels((int)&in,dwx);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  return;
}

Assistant:

static void
loadCPP (
    pixels&            p,
    const std::string& filename,
    bool               tiled,
    int                fw,
    int                fh,
    int                dwx,
    int                dwy)
{
    InputFile in (filename.c_str ());
    {
        FrameBuffer fb;
        V2i         origin{dwx, dwy};
        fb.insert (
            "I",
            Slice::Make (
                IMF::UINT,
                p.i.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                in.header ().channels ()["I"].xSampling,
                in.header ().channels ()["I"].ySampling,
                0.0,
                false,
                false));
        fb.insert (
            "H",
            Slice::Make (
                IMF::HALF,
                p.h.data (),
                origin,
                fw,
                fh,
                0,
                2 * p._stride_x,
                in.header ().channels ()["H"].xSampling,
                in.header ().channels ()["H"].ySampling,
                0.0,
                false,
                false));

        for (int c = 0; c < 4; c++)
        {
            fb.insert (
                channels[c],
                Slice::Make (
                    IMF::HALF,
                    p.rgba[c].data (),
                    origin,
                    fw,
                    fh,
                    0,
                    2 * p._stride_x,
                    in.header ().channels ()[channels[c]].xSampling,
                    in.header ().channels ()[channels[c]].ySampling,
                    0.0,
                    false,
                    false));
        }
        fb.insert (
            "F",
            Slice::Make (
                IMF::FLOAT,
                p.f.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                in.header ().channels ()["F"].xSampling,
                in.header ().channels ()["F"].ySampling,
                0.0,
                false,
                false));

        in.setFrameBuffer (fb);
        in.readPixels (dwy, dwy + fh - 1);
    }
}